

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_column_reader.cpp
# Opt level: O3

idx_t __thiscall
duckdb::StructColumnReader::Read
          (StructColumnReader *this,uint64_t num_values,data_ptr_t define_out,data_ptr_t repeat_out,
          Vector *result)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  byte bVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  Vector *pVVar4;
  int iVar5;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_01;
  reference this_02;
  reference this_03;
  type this_04;
  pointer pCVar6;
  undefined4 extraout_var;
  idx_t iVar7;
  TemplatedValidityData<unsigned_long> *pTVar8;
  _Head_base<0UL,_unsigned_long_*,_false> _Var9;
  runtime_error *this_05;
  InternalException *this_06;
  size_type __n;
  idx_t idx_in_entry;
  ulong uVar10;
  optional_idx read_count;
  optional_idx local_80;
  data_ptr_t local_78;
  uint64_t local_70;
  string local_68;
  Vector *local_48;
  data_ptr_t local_40;
  idx_t local_38;
  
  local_78 = define_out;
  local_40 = repeat_out;
  this_01 = StructVector::GetEntries(result);
  if ((this->super_ColumnReader).pending_skips != 0) {
    this_06 = (InternalException *)__cxa_allocate_exception(0x10);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"StructColumnReader cannot have pending skips","");
    InternalException::InternalException(this_06,&local_68);
    __cxa_throw(this_06,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  local_48 = result;
  if (num_values != 0) {
    switchD_012e5a64::default
              (local_78,(int)((this->super_ColumnReader).column_schema)->max_define,num_values);
  }
  local_80.index = 0xffffffffffffffff;
  if ((this->child_readers).
      super_vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->child_readers).
      super_vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    __n = 0;
    local_70 = num_values;
    do {
      this_02 = vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_true>
                ::operator[](&this->child_readers,__n);
      this_03 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                ::operator[](this_01,__n);
      this_04 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          (this_03);
      if ((this_02->
          super_unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>)._M_t.
          super___uniq_ptr_impl<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>_>.
          _M_t.
          super__Tuple_impl<0UL,_duckdb::ColumnReader_*,_std::default_delete<duckdb::ColumnReader>_>
          .super__Head_base<0UL,_duckdb::ColumnReader_*,_false>._M_head_impl == (ColumnReader *)0x0)
      {
        Vector::SetVectorType(this_04,CONSTANT_VECTOR);
        ConstantVector::SetNull(this_04,true);
      }
      else {
        pCVar6 = unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>::
                 operator->(this_02);
        iVar5 = (*pCVar6->_vptr_ColumnReader[3])(pCVar6,local_70,local_78,local_40,this_04);
        if ((element_type *)local_80.index == (element_type *)0xffffffffffffffff) {
          optional_idx::optional_idx((optional_idx *)&local_68,CONCAT44(extraout_var,iVar5));
          local_80.index = (idx_t)local_68._M_dataplus._M_p;
        }
        else {
          iVar7 = optional_idx::GetIndex(&local_80);
          if (iVar7 != CONCAT44(extraout_var,iVar5)) {
            this_05 = (runtime_error *)__cxa_allocate_exception(0x10);
            ::std::runtime_error::runtime_error(this_05,"Struct child row count mismatch");
            __cxa_throw(this_05,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error
                       );
          }
        }
      }
      __n = __n + 1;
    } while (__n < (ulong)((long)(this->child_readers).
                                 super_vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->child_readers).
                                 super_vector<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
                                 .
                                 super__Vector_base<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnReader,_std::default_delete<duckdb::ColumnReader>,_true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3));
    num_values = local_70;
    if ((element_type *)local_80.index != (element_type *)0xffffffffffffffff) goto LAB_01cba65e;
  }
  optional_idx::optional_idx((optional_idx *)&local_68,num_values);
  local_80.index = (idx_t)local_68._M_dataplus._M_p;
LAB_01cba65e:
  pVVar4 = local_48;
  FlatVector::VerifyFlatVector(local_48);
  iVar7 = optional_idx::GetIndex(&local_80);
  if (iVar7 != 0) {
    uVar10 = 0;
    do {
      if ((ulong)local_78[uVar10] < ((this->super_ColumnReader).column_schema)->max_define) {
        _Var9._M_head_impl =
             (pVVar4->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (_Var9._M_head_impl == (unsigned_long *)0x0) {
          local_38 = (pVVar4->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_68,&local_38);
          sVar3 = local_68._M_string_length;
          _Var2._M_p = local_68._M_dataplus._M_p;
          local_68._M_dataplus._M_p = (pointer)0x0;
          local_68._M_string_length = 0;
          this_00 = (pVVar4->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                    internal.
                    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi;
          (pVVar4->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)_Var2._M_p;
          (pVVar4->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar3;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._M_string_length);
            }
          }
          pTVar8 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                             (&(pVVar4->validity).super_TemplatedValidityMask<unsigned_long>.
                               validity_data);
          _Var9._M_head_impl =
               (pTVar8->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          (pVVar4->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               _Var9._M_head_impl;
        }
        bVar1 = (byte)uVar10 & 0x3f;
        _Var9._M_head_impl[uVar10 >> 6] =
             _Var9._M_head_impl[uVar10 >> 6] & (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
      }
      uVar10 = uVar10 + 1;
      iVar7 = optional_idx::GetIndex(&local_80);
    } while (uVar10 < iVar7);
  }
  iVar7 = optional_idx::GetIndex(&local_80);
  return iVar7;
}

Assistant:

idx_t StructColumnReader::Read(uint64_t num_values, data_ptr_t define_out, data_ptr_t repeat_out, Vector &result) {
	auto &struct_entries = StructVector::GetEntries(result);
	D_ASSERT(StructType::GetChildTypes(Type()).size() == struct_entries.size());

	if (pending_skips > 0) {
		throw InternalException("StructColumnReader cannot have pending skips");
	}

	// If the child reader values are all valid, "define_out" may not be initialized at all
	// So, we just initialize them to all be valid beforehand
	std::fill_n(define_out, num_values, MaxDefine());

	optional_idx read_count;
	for (idx_t i = 0; i < child_readers.size(); i++) {
		auto &child = child_readers[i];
		auto &target_vector = *struct_entries[i];
		if (!child) {
			// if we are not scanning this vector - set it to NULL
			target_vector.SetVectorType(VectorType::CONSTANT_VECTOR);
			ConstantVector::SetNull(target_vector, true);
			continue;
		}
		auto child_num_values = child->Read(num_values, define_out, repeat_out, target_vector);
		if (!read_count.IsValid()) {
			read_count = child_num_values;
		} else if (read_count.GetIndex() != child_num_values) {
			throw std::runtime_error("Struct child row count mismatch");
		}
	}
	if (!read_count.IsValid()) {
		read_count = num_values;
	}
	// set the validity mask for this level
	auto &validity = FlatVector::Validity(result);
	for (idx_t i = 0; i < read_count.GetIndex(); i++) {
		if (define_out[i] < MaxDefine()) {
			validity.SetInvalid(i);
		}
	}

	return read_count.GetIndex();
}